

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O1

bool Cipher::generateClustersInitialGuess
               (TParameters *params,TSimilarityMap *ccMap,TClusters *clusters)

{
  double *pdVar1;
  double dVar2;
  pointer piVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  undefined8 *puVar6;
  mapped_type *pmVar7;
  int *piVar8;
  int iVar9;
  undefined8 *puVar10;
  long lVar11;
  ulong uVar12;
  undefined8 *puVar13;
  __normal_iterator<Pair_*,_std::vector<Pair,_std::allocator<Pair>_>_> __i;
  ulong uVar14;
  ulong uVar15;
  pointer piVar16;
  undefined8 *puVar17;
  size_t __n;
  undefined8 *puVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  size_type __new_size;
  ulong uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  TClusters *__range2;
  vector<bool,_std::allocator<bool>_> used;
  undefined8 *local_e8;
  allocator_type local_da;
  bool local_d9;
  TClusters *local_d8;
  undefined8 *local_d0;
  TParameters *local_c8;
  ulong local_c0;
  ulong local_b8;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_b0;
  size_type local_80;
  ulong local_78;
  ulong local_70;
  long local_68;
  ulong local_60;
  ulong local_58;
  TSimilarityMap *local_50;
  size_t local_48;
  undefined8 local_40;
  long local_38;
  
  uVar14 = ((long)(ccMap->
                  super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(ccMap->
                  super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  uVar20 = (uint)uVar14;
  __new_size = (size_type)(int)uVar20;
  local_d8 = clusters;
  local_c8 = params;
  std::vector<int,_std::allocator<int>_>::resize(clusters,__new_size);
  auVar5 = _DAT_0019f140;
  if (0 < (int)uVar20) {
    piVar16 = (local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar11 = (ulong)(uVar20 & 0x7fffffff) - 1;
    auVar26._8_4_ = (int)lVar11;
    auVar26._0_8_ = lVar11;
    auVar26._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar12 = 0;
    auVar26 = auVar26 ^ _DAT_0019f140;
    auVar27 = _DAT_0019f130;
    do {
      auVar28 = auVar27 ^ auVar5;
      if ((bool)(~(auVar28._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar28._0_4_ ||
                  auVar26._4_4_ < auVar28._4_4_) & 1)) {
        piVar16[uVar12] = (int)uVar12;
      }
      if ((auVar28._12_4_ != auVar26._12_4_ || auVar28._8_4_ <= auVar26._8_4_) &&
          auVar28._12_4_ <= auVar26._12_4_) {
        piVar16[uVar12 + 1] = (int)uVar12 + 1;
      }
      uVar12 = uVar12 + 2;
      lVar11 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + 2;
      auVar27._8_8_ = lVar11 + 2;
    } while ((uVar20 + 1 & 0xfffffffe) != uVar12);
  }
  local_c0 = uVar14;
  local_80 = __new_size;
  if ((int)uVar20 < 2) {
    puVar17 = (undefined8 *)0x0;
    puVar18 = (undefined8 *)0x0;
    local_e8 = (undefined8 *)0x0;
  }
  else {
    local_78 = (ulong)(uVar20 - 1);
    uVar14 = (ulong)(uVar20 & 0x7fffffff);
    uVar12 = 1;
    lVar11 = 0x10;
    local_48 = 0x7ffffffffffffff0;
    local_70 = 0;
    local_e8 = (undefined8 *)0x0;
    puVar18 = (undefined8 *)0x0;
    puVar17 = (undefined8 *)0x0;
    local_58 = uVar14;
    local_50 = ccMap;
    do {
      local_38 = local_70 * 3;
      local_b8 = local_70;
      local_70 = local_70 + 1;
      local_68 = lVar11;
      local_60 = uVar12;
      do {
        uVar25 = *(undefined8 *)
                  (*(long *)((long)&(((ccMap->
                                      super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<stMatch,_std::allocator<stMatch>_>)._M_impl.
                                    super__Vector_impl_data + local_38 * 8) + lVar11);
        if (puVar18 == puVar17) {
          __n = (long)puVar18 - (long)local_e8;
          local_d0 = puVar17;
          if (__n == local_48) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar19 = (long)__n >> 4;
          uVar14 = 1;
          if (puVar18 != local_e8) {
            uVar14 = uVar19;
          }
          uVar15 = uVar14 + uVar19;
          if (0x7fffffffffffffe < uVar15) {
            uVar15 = 0x7ffffffffffffff;
          }
          uVar22 = 0x7ffffffffffffff;
          if (!CARRY8(uVar14,uVar19)) {
            uVar22 = uVar15;
          }
          if (uVar22 == 0) {
            puVar6 = (undefined8 *)0x0;
          }
          else {
            local_40 = uVar25;
            puVar6 = (undefined8 *)operator_new(uVar22 << 4);
            uVar25 = local_40;
          }
          *(int *)(puVar6 + uVar19 * 2) = (int)local_b8;
          *(int *)((long)puVar6 + uVar19 * 0x10 + 4) = (int)uVar12;
          puVar6[uVar19 * 2 + 1] = uVar25;
          if (0 < (long)__n) {
            memmove(puVar6,local_e8,__n);
          }
          if (local_e8 != (undefined8 *)0x0) {
            operator_delete(local_e8,(long)local_d0 - (long)local_e8);
          }
          puVar18 = (undefined8 *)(__n + (long)puVar6);
          puVar17 = puVar6 + uVar22 * 2;
          uVar14 = local_58;
          ccMap = local_50;
          local_e8 = puVar6;
        }
        else {
          *(int *)puVar18 = (int)local_b8;
          *(int *)((long)puVar18 + 4) = (int)uVar12;
          puVar18[1] = uVar25;
        }
        puVar18 = puVar18 + 2;
        uVar12 = uVar12 + 1;
        lVar11 = lVar11 + 0x10;
      } while (uVar14 != uVar12);
      uVar12 = local_60 + 1;
      lVar11 = local_68 + 0x10;
    } while (local_70 != local_78);
  }
  if (local_e8 != puVar18) {
    uVar14 = (long)puVar18 - (long)local_e8 >> 4;
    lVar11 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair*,std::vector<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair,std::allocator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_e8,puVar18,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)puVar18 - (long)local_e8 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair*,std::vector<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair,std::allocator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (local_e8,puVar18);
    }
    else {
      puVar6 = local_e8 + 0x20;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair*,std::vector<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair,std::allocator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (local_e8,puVar6);
      for (; puVar6 != puVar18; puVar6 = puVar6 + 2) {
        uVar25 = *puVar6;
        dVar2 = (double)puVar6[1];
        puVar10 = puVar6;
        puVar13 = puVar6;
        if ((double)puVar6[-1] <= dVar2 && dVar2 != (double)puVar6[-1]) {
          do {
            puVar10 = puVar13 + -2;
            *puVar13 = puVar13[-2];
            puVar13[1] = puVar13[-1];
            pdVar1 = (double *)(puVar13 + -3);
            puVar13 = puVar10;
          } while (*pdVar1 <= dVar2 && dVar2 != *pdVar1);
        }
        *puVar10 = uVar25;
        puVar10[1] = dVar2;
      }
    }
  }
  local_d9 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_b0,local_80,&local_d9,&local_da);
  uVar14 = (ulong)((long)puVar18 - (long)local_e8) >> 4;
  if (0 < (int)uVar14) {
    piVar16 = (local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = 0;
    uVar12 = local_c0;
    do {
      iVar23 = piVar16[*(int *)(local_e8 + uVar19 * 2)];
      uVar15 = (ulong)iVar23;
      iVar21 = piVar16[*(int *)((long)local_e8 + uVar19 * 0x10 + 4)];
      uVar22 = (ulong)iVar21;
      iVar9 = 0xd;
      if (iVar23 != iVar21) {
        uVar24 = uVar15 + 0x3f;
        if (-1 < (long)uVar15) {
          uVar24 = uVar15;
        }
        if ((*(ulong *)(local_b0._M_impl._0_8_ +
                       (((long)uVar24 >> 6) +
                       ((ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) >>
             (uVar15 & 0x3f) & 1) == 0) {
          uVar15 = uVar22 + 0x3f;
          if (-1 < (long)uVar22) {
            uVar15 = uVar22;
          }
          if ((*(ulong *)(local_b0._M_impl._0_8_ +
                         (((long)uVar15 >> 6) +
                         ((ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) >>
               (uVar22 & 0x3f) & 1) == 0) {
            iVar9 = iVar21;
            if (iVar21 < iVar23) {
              iVar9 = iVar23;
            }
            if (iVar23 < iVar21) {
              iVar21 = iVar23;
            }
            if (0 < (int)local_c0) {
              uVar15 = 0;
              do {
                if (piVar16[uVar15] == iVar9) {
                  piVar16[uVar15] = iVar21;
                }
                uVar15 = uVar15 + 1;
              } while ((local_c0 & 0x7fffffff) != uVar15);
            }
            uVar22 = (ulong)iVar9;
            uVar15 = uVar22 + 0x3f;
            if (-1 < (long)uVar22) {
              uVar15 = uVar22;
            }
            *(ulong *)(local_b0._M_impl._0_8_ +
                      (((long)uVar15 >> 6) +
                      ((ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) =
                 *(ulong *)(local_b0._M_impl._0_8_ +
                           (((long)uVar15 >> 6) +
                           ((ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) |
                 1L << ((byte)iVar9 & 0x3f);
            uVar20 = (int)uVar12 - 1;
            uVar12 = (ulong)uVar20;
            iVar9 = 0xb;
            if (local_c8->maxClusters < (int)uVar20) {
              iVar9 = 0;
            }
          }
        }
      }
    } while (((iVar9 == 0xd) || (iVar9 == 0)) &&
            (uVar19 = uVar19 + 1, uVar19 != (uVar14 & 0x7fffffff)));
  }
  if ((_Bit_type *)local_b0._M_impl._0_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_b0._M_impl._0_8_,
                    (long)local_b0._M_impl.super__Rb_tree_header._M_header._M_right -
                    local_b0._M_impl._0_8_);
    local_b0._M_impl._0_8_ = (_Bit_type *)0x0;
  }
  local_b0._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&local_b0 + 8);
  local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  iVar23 = 0;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  piVar16 = (local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar3 = (local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (piVar16 != piVar3) {
    do {
      pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_b0,piVar16);
      if (*pmVar7 < 1) {
        pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_b0,piVar16);
        iVar23 = iVar23 + 1;
        *pmVar7 = iVar23;
      }
      piVar16 = piVar16 + 1;
    } while (piVar16 != piVar3);
  }
  piVar16 = (local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar3 = (local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  if (piVar16 != piVar3) {
    do {
      pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_b0,piVar16);
      *piVar16 = *pmVar7 + -1;
      piVar16 = piVar16 + 1;
    } while (piVar16 != piVar3);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_b0);
  piVar8 = (local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  piVar4 = (local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  if (piVar8 != piVar4) {
    do {
      if ((*piVar8 < 0) || (local_c8->maxClusters <= *piVar8)) {
        __assert_fail("cid >= 0 && cid < params.maxClusters",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/subbreak3.cpp"
                      ,0x3a4,
                      "bool Cipher::generateClustersInitialGuess(const TParameters &, const TSimilarityMap &, TClusters &)"
                     );
      }
      piVar8 = piVar8 + 1;
    } while (piVar8 != piVar4);
  }
  if (local_e8 != (undefined8 *)0x0) {
    operator_delete(local_e8,(long)puVar17 - (long)local_e8);
  }
  return true;
}

Assistant:

bool generateClustersInitialGuess(
            const TParameters & params,
            const TSimilarityMap & ccMap,
            TClusters & clusters) {
        int n = ccMap.size();

        int nClusters = n;
        clusters.resize(n);
        for (int i = 0; i < n; ++i) {
            clusters[i] = i;
        }

        struct Pair {
            int i;
            int j;
            double cc;

            bool operator < (const Pair & a) const { return cc > a.cc; }
        };

        std::vector<Pair> ccPairs;
        for (int i = 0; i < n - 1; ++i) {
            for (int j = i + 1; j < n; ++j) {
                ccPairs.emplace_back(Pair{i, j, ccMap[i][j].cc});
            }
        }

        std::sort(ccPairs.begin(), ccPairs.end());

        {
            std::vector<bool> used(n);

            for (int k = 0; k < (int) ccPairs.size(); ++k) {
                int i = ccPairs[k].i;
                int j = ccPairs[k].j;

                if (clusters[i] == clusters[j]) continue;

                int cidi = clusters[i];
                int cidj = clusters[j];

                if (used[cidi] || used[cidj]) continue;

                if (cidi > cidj) {
                    std::swap(cidi, cidj);
                }

                for (int p = 0; p < n; ++p) {
                    if (clusters[p] == cidj) {
                        clusters[p] = cidi;
                    }
                }
                used[cidj] = true;
                --nClusters;

                if (nClusters <= params.maxClusters) break;
            }
        }

        {
            int cnt = 0;
            std::map<int, int> used;
            for (auto & cid : clusters) {
                if (used[cid] > 0) continue;
                used[cid] = ++cnt;
            }

            for (auto & cid : clusters) {
                cid = used[cid] - 1;
            }
        }

        //printf("nClusters = %d\n", nClusters);
        for (auto & cid : clusters) {
            assert(cid >= 0 && cid < params.maxClusters);
        }

        return true;
    }